

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

bool __thiscall RenX::Server::disarm(Server *this,int id)

{
  byte bVar1;
  ssize_t sVar2;
  size_t __n;
  int in_R8D;
  bool local_65;
  string local_50;
  __sv_type local_30;
  int local_1c;
  Server *pSStack_18;
  int id_local;
  Server *this_local;
  
  bVar1 = this->m_competitive & 1;
  __n = (size_t)bVar1;
  local_65 = false;
  local_1c = id;
  pSStack_18 = this;
  if (bVar1 == 0) {
    string_printf_abi_cxx11_(&local_50,"disarm pid%d",(ulong)(uint)id);
    local_30 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
    sVar2 = send(this,(int)local_30._M_len,local_30._M_str,__n,in_R8D);
    local_65 = 0 < (int)sVar2;
  }
  this_local._7_1_ = local_65;
  if (bVar1 == 0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool RenX::Server::disarm(int id) {
	return m_competitive == false && send(string_printf("disarm pid%d", id)) > 0;
}